

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O3

BCReg snap_usedef(jit_State *J,uint8_t *udf,BCIns *pc,BCReg maxslot)

{
  TValue *pTVar1;
  byte bVar3;
  undefined8 *puVar2;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint *puVar7;
  uint uVar8;
  ushort uVar9;
  BCReg BVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  
  if (maxslot == 0) {
LAB_0012c5e3:
    maxslot = 0;
switchD_0012c2b3_caseD_c:
    return maxslot;
  }
  uVar4 = (ulong)maxslot;
  memset(udf,1,uVar4);
  for (puVar2 = (undefined8 *)(J->L->openupval).gcptr64; puVar2 != (undefined8 *)0x0;
      puVar2 = (undefined8 *)*puVar2) {
    pTVar1 = J->L->base;
    if ((TValue *)puVar2[4] < pTVar1) break;
    udf[(long)puVar2[4] - (long)pTVar1 >> 3] = '\0';
  }
LAB_0012c267:
  do {
    uVar5 = *pc;
    uVar8 = uVar5 & 0xff;
    uVar9 = lj_bc_mode[uVar8];
    if ((uVar9 & 0x78) == 0x18) {
      udf[uVar5 >> 0x18] = udf[uVar5 >> 0x18] & 0xfe;
    }
    puVar7 = pc + 1;
    bVar3 = (byte)(uVar5 >> 8);
    switch(uVar9 >> 7 & 0xf) {
    case 3:
      udf[uVar5 >> 0x10 & 0xff] = udf[uVar5 >> 0x10 & 0xff] & 0xfe;
      break;
    case 4:
      uVar12 = uVar5 >> 0x18;
      uVar14 = (ulong)uVar12;
      uVar13 = uVar5 >> 0x10 & 0xff;
      if (uVar12 <= uVar13) {
        uVar6 = (ulong)(uVar5 >> 0x18);
        uVar14 = (ulong)(((uVar13 + (uVar5 >> 0x18)) - uVar12) + 1);
        do {
          udf[uVar6] = udf[uVar6] & 0xfe;
          uVar6 = uVar6 + 1;
        } while (uVar14 != uVar6);
      }
      if ((uint)uVar14 < maxslot) {
        do {
          udf[uVar14] = udf[uVar14] * '\x03';
          uVar14 = uVar14 + 1;
        } while (uVar4 != uVar14);
      }
      break;
    case 6:
      uVar13 = (uVar5 & 0xff) - 0x51;
      if ((uVar13 < 7) && ((0x49U >> (uVar13 & 0x1f) & 1) != 0)) goto switchD_0012c2b3_caseD_d;
      if (uVar8 - 0x4d < 0xfffffffc) break;
      uVar13 = (uint)bVar3;
      uVar5 = ((uVar5 >> 0x10) - 1) + uVar13;
      if (uVar8 == 0x49) {
        uVar5 = maxslot;
      }
      uVar14 = (ulong)uVar13;
      if (bVar3 != 0) {
        uVar6 = 0;
        do {
          udf[uVar6] = udf[uVar6] * '\x03';
          uVar6 = uVar6 + 1;
        } while (uVar14 != uVar6);
      }
      if (uVar13 < uVar5) {
        do {
          udf[uVar14] = udf[uVar14] & 0xfe;
          uVar14 = uVar14 + 1;
          uVar13 = uVar5;
        } while (uVar5 != uVar14);
      }
      if (uVar13 < maxslot) {
        uVar14 = (ulong)uVar13;
        do {
          udf[uVar14] = udf[uVar14] * '\x03';
          uVar14 = uVar14 + 1;
        } while (uVar4 != uVar14);
      }
      goto LAB_0012c5e3;
    case 0xc:
      goto switchD_0012c2b3_caseD_c;
    case 0xd:
switchD_0012c2b3_caseD_d:
      if (uVar8 - 0x4d < 5) {
        uVar5 = bVar3 + 3;
LAB_0012c540:
        if (uVar5 < maxslot) {
          uVar14 = (ulong)uVar5;
          do {
            udf[uVar14] = udf[uVar14] * '\x03';
            uVar14 = uVar14 + 1;
          } while (uVar4 != uVar14);
        }
        if (uVar5 < maxslot) {
          return uVar5;
        }
        return maxslot;
      }
      if (uVar8 - 0x52 < 3) {
        uVar5 = ((uint)bVar3 + (uint)*(byte *)((long)pc + -1)) - 1;
        goto LAB_0012c540;
      }
      if (uVar8 != 0x32) {
        uVar5 = (uint)bVar3;
        goto LAB_0012c540;
      }
      if (-1 < (int)uVar5) {
        return maxslot;
      }
      puVar7 = puVar7 + ((ulong)(uVar5 >> 0x10) - 0x8000);
    }
    uVar9 = uVar9 & 7;
    pc = puVar7;
    if (uVar9 != 1) {
      if (uVar9 == 2) {
        if (uVar8 - 0x41 < 6) {
          BVar10 = maxslot;
          if (((uVar5 & 0xfd) != 0x41) && (uVar13 = uVar5 >> 0x10 & 0xff, uVar13 != 0)) {
            BVar10 = uVar13 + (uVar5 >> 8 & 0xff) + 1;
          }
          uVar5 = uVar5 >> 8 & 0xff;
          udf[(ulong)uVar5 + 1] = udf[(ulong)uVar5 + 1] * '\x03';
          uVar13 = ((uint)(1 < uVar8 - 0x45) * 3 + uVar5) - 3;
          uVar14 = (ulong)uVar13;
          if (uVar13 < BVar10) {
            uVar14 = (ulong)uVar13;
            do {
              udf[uVar14] = udf[uVar14] & 0xfe;
              uVar14 = uVar14 + 1;
            } while (uVar14 < BVar10);
          }
          if ((uint)uVar14 < maxslot) {
            uVar14 = uVar14 & 0xffffffff;
            do {
              udf[uVar14] = udf[uVar14] * '\x03';
              uVar14 = uVar14 + 1;
            } while (uVar4 != uVar14);
          }
          if (0xfffffffd < uVar8 - 0x45) {
            if (uVar5 != 0) {
              uVar4 = 0;
              do {
                udf[uVar4] = udf[uVar4] * '\x03';
                uVar4 = uVar4 + 1;
              } while (bVar3 != uVar4);
              return 0;
            }
            goto LAB_0012c5e3;
          }
        }
        else if ((char)uVar5 == ',') {
          if ((uVar5 >> 8 & 0xff) <= uVar5 >> 0x10) {
            uVar14 = (ulong)(uVar5 >> 8 & 0xff);
            do {
              udf[uVar14] = udf[uVar14] * '\x03';
              uVar14 = uVar14 + 1;
            } while ((ulong)(uVar5 >> 0x10) + 1 != uVar14);
          }
        }
        else if ((uVar5 & 0xff) == 0x3f) {
          if (bVar3 - 1 < maxslot) {
            lVar11 = 0;
            do {
              udf[lVar11 + (ulong)(bVar3 - 1)] = udf[lVar11 + (ulong)(bVar3 - 1)] & 0xfe;
              lVar11 = lVar11 + 1;
            } while ((maxslot + 1) - (uint)bVar3 != (int)lVar11);
          }
        }
        else if ((uVar5 & 0xff) == 0x47) {
          return maxslot;
        }
      }
      else if (uVar9 == 3) {
        udf[uVar5 >> 8 & 0xff] = udf[uVar5 >> 8 & 0xff] & 0xfe;
      }
      goto LAB_0012c267;
    }
    if ((uVar5 & 0xfe) != 0xc) {
      uVar5 = uVar5 >> 8 & 0xff;
      udf[uVar5] = udf[uVar5] * '\x03';
    }
  } while( true );
}

Assistant:

static BCReg snap_usedef(jit_State *J, uint8_t *udf,
			 const BCIns *pc, BCReg maxslot)
{
  BCReg s;
  GCobj *o;

  if (maxslot == 0) return 0;
#ifdef LUAJIT_USE_VALGRIND
  /* Avoid errors for harmless reads beyond maxslot. */
  memset(udf, 1, SNAP_USEDEF_SLOTS);
#else
  memset(udf, 1, maxslot);
#endif

  /* Treat open upvalues as used. */
  o = gcref(J->L->openupval);
  while (o) {
    if (uvval(gco2uv(o)) < J->L->base) break;
    udf[uvval(gco2uv(o)) - J->L->base] = 0;
    o = gcref(o->gch.nextgc);
  }

#define USE_SLOT(s)		udf[(s)] &= ~1
#define DEF_SLOT(s)		udf[(s)] *= 3

  /* Scan through following bytecode and check for uses/defs. */
  lj_assertJ(pc >= proto_bc(J->pt) && pc < proto_bc(J->pt) + J->pt->sizebc,
	     "snapshot PC out of range");
  for (;;) {
    BCIns ins = *pc++;
    BCOp op = bc_op(ins);
    switch (bcmode_b(op)) {
    case BCMvar: USE_SLOT(bc_b(ins)); break;
    default: break;
    }
    switch (bcmode_c(op)) {
    case BCMvar: USE_SLOT(bc_c(ins)); break;
    case BCMrbase:
      lj_assertJ(op == BC_CAT, "unhandled op %d with RC rbase", op);
      for (s = bc_b(ins); s <= bc_c(ins); s++) USE_SLOT(s);
      for (; s < maxslot; s++) DEF_SLOT(s);
      break;
    case BCMjump:
    handle_jump: {
      BCReg minslot = bc_a(ins);
      if (op >= BC_FORI && op <= BC_JFORL) minslot += FORL_EXT;
      else if (op >= BC_ITERL && op <= BC_JITERL) minslot += bc_b(pc[-2])-1;
      else if (op == BC_UCLO) {
	ptrdiff_t delta = bc_j(ins);
	if (delta < 0) return maxslot;  /* Prevent loop. */
	pc += delta;
	break;
      }
      for (s = minslot; s < maxslot; s++) DEF_SLOT(s);
      return minslot < maxslot ? minslot : maxslot;
      }
    case BCMlit:
      if (op == BC_JFORL || op == BC_JITERL || op == BC_JLOOP) {
	goto handle_jump;
      } else if (bc_isret(op)) {
	BCReg top = op == BC_RETM ? maxslot : (bc_a(ins) + bc_d(ins)-1);
	for (s = 0; s < bc_a(ins); s++) DEF_SLOT(s);
	for (; s < top; s++) USE_SLOT(s);
	for (; s < maxslot; s++) DEF_SLOT(s);
	return 0;
      }
      break;
    case BCMfunc: return maxslot;  /* NYI: will abort, anyway. */
    default: break;
    }
    switch (bcmode_a(op)) {
    case BCMvar: USE_SLOT(bc_a(ins)); break;
    case BCMdst:
       if (!(op == BC_ISTC || op == BC_ISFC)) DEF_SLOT(bc_a(ins));
       break;
    case BCMbase:
      if (op >= BC_CALLM && op <= BC_ITERN) {
	BCReg top = (op == BC_CALLM || op == BC_CALLMT || bc_c(ins) == 0) ?
		    maxslot : (bc_a(ins) + bc_c(ins)+LJ_FR2);
	if (LJ_FR2) DEF_SLOT(bc_a(ins)+1);
	s = bc_a(ins) - ((op == BC_ITERC || op == BC_ITERN) ? 3 : 0);
	for (; s < top; s++) USE_SLOT(s);
	for (; s < maxslot; s++) DEF_SLOT(s);
	if (op == BC_CALLT || op == BC_CALLMT) {
	  for (s = 0; s < bc_a(ins); s++) DEF_SLOT(s);
	  return 0;
	}
      } else if (op == BC_VARG) {
	return maxslot;  /* NYI: punt. */
      } else if (op == BC_KNIL) {
	for (s = bc_a(ins); s <= bc_d(ins); s++) DEF_SLOT(s);
      } else if (op == BC_TSETM) {
	for (s = bc_a(ins)-1; s < maxslot; s++) USE_SLOT(s);
      }
      break;
    default: break;
    }
    lj_assertJ(pc >= proto_bc(J->pt) && pc < proto_bc(J->pt) + J->pt->sizebc,
	       "use/def analysis PC out of range");
  }

#undef USE_SLOT
#undef DEF_SLOT

  return 0;  /* unreachable */
}